

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O2

idx_t __thiscall
duckdb::PhysicalInsert::OnConflictHandling
          (PhysicalInsert *this,TableCatalogEntry *table,ExecutionContext *context,
          InsertGlobalState *gstate,InsertLocalState *lstate,DataChunk *insert_chunk)

{
  DataChunk *this_00;
  pointer puVar1;
  unsigned_long *size;
  _Hash_node_base _Var2;
  PhysicalInsert *op;
  InsertLocalState *pIVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  shared_ptr<duckdb::DataTableInfo,_true> *this_01;
  DataTableInfo *pDVar7;
  pthread_mutex_t *ppVar8;
  type pIVar9;
  ConstraintState *constraint_state;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  mapped_type *pmVar10;
  iterator iVar11;
  _Rb_tree_node_base *p_Var12;
  idx_t iVar13;
  idx_t iVar14;
  NotImplementedException *this_02;
  BoundIndex *bound_index;
  element_type *peVar15;
  __node_base *p_Var16;
  TableCatalogEntry *table_01;
  _Base_ptr __v;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index_1;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *this_03;
  _Hash_node_base *p_Var17;
  ExecutionContext *context_00;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  pointer puVar18;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *column_ids;
  __node_base *p_Var19;
  allocator local_1d9;
  PhysicalInsert *local_1d8;
  ExecutionContext *local_1d0;
  pthread_mutex_t *local_1c8;
  pthread_mutex_t *local_1c0;
  InsertLocalState *local_1b8;
  TableCatalogEntry *local_1b0;
  vector<std::reference_wrapper<duckdb::Vector>,_true> columns;
  ConflictInfo conflict_info;
  ValidityMask valid;
  SelectionVector *local_138;
  ValidityMask not_a_conflict;
  unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
  sort_keys;
  map<unsigned_long,_duckdb::vector<unsigned_long,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
  inner_conflicts;
  unordered_set<duckdb::BoundIndex_*,_std::hash<duckdb::BoundIndex_*>,_std::equal_to<duckdb::BoundIndex_*>,_std::allocator<duckdb::BoundIndex_*>_>
  matched_indexes;
  DataTable *table_00;
  
  iVar6 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0x10])(table);
  table_00 = (DataTable *)CONCAT44(extraout_var,iVar6);
  local_1d8 = (PhysicalInsert *)LocalStorage::Get(context->client,table_00->db);
  if (this->action_type == THROW) {
    constraint_state = InsertLocalState::GetConstraintState(lstate,table_00,table);
    storage = LocalStorage::GetStorage((LocalStorage *)local_1d8,table_00);
    iVar14 = 0;
    DataTable::VerifyAppendConstraints
              (table_00,constraint_state,context->client,insert_chunk,storage,
               (optional_ptr<duckdb::ConflictManager,_true>)0x0);
  }
  else {
    conflict_info.only_check_unique = true;
    local_1b8 = lstate;
    local_1b0 = table;
    conflict_info.column_ids = &this->conflict_target;
    this_01 = DataTable::GetDataTableInfo(table_00);
    pDVar7 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_01);
    local_1d0 = context;
    ppVar8 = (pthread_mutex_t *)
             LocalStorage::GetIndexes((LocalStorage *)local_1d8,context->client,table_00);
    matched_indexes._M_h._M_buckets = &matched_indexes._M_h._M_single_bucket;
    matched_indexes._M_h._M_bucket_count = 1;
    matched_indexes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    matched_indexes._M_h._M_element_count = 0;
    matched_indexes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    matched_indexes._M_h._M_rehash_policy._M_next_resize = 0;
    matched_indexes._M_h._M_single_bucket = (__node_base_ptr)0x0;
    column_ids = &this->conflict_target;
    local_1d8 = this;
    if ((this->conflict_target)._M_h._M_element_count == 0) {
      local_1c0 = (pthread_mutex_t *)&pDVar7->indexes;
      local_1c8 = ppVar8;
      ::std::mutex::lock((mutex *)&local_1c0->__data);
      puVar1 = (pDVar7->indexes).indexes.
               super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar18 = (pDVar7->indexes).indexes.
                     super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar1;
          puVar18 = puVar18 + 1) {
        pIVar9 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                           (puVar18);
        iVar6 = (*pIVar9->_vptr_Index[5])(pIVar9);
        if ((byte)((char)iVar6 - 1U) < 2) {
          bVar5 = ConflictInfo::ConflictTargetMatches(&conflict_info,pIVar9);
          if (bVar5) {
            sort_keys._M_h._M_buckets = (__buckets_ptr)pIVar9;
            ::std::__detail::
            _Insert<duckdb::BoundIndex_*,_duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>,_std::__detail::_Identity,_std::equal_to<duckdb::BoundIndex_*>,_std::hash<duckdb::BoundIndex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            ::insert((_Insert<duckdb::BoundIndex_*,_duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>,_std::__detail::_Identity,_std::equal_to<duckdb::BoundIndex_*>,_std::hash<duckdb::BoundIndex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                      *)&matched_indexes,(value_type *)&sort_keys);
          }
        }
      }
      pthread_mutex_unlock(local_1c0);
      ppVar8 = local_1c8;
      ::std::mutex::lock((mutex *)&local_1c8->__data);
      puVar18 = *(pointer *)((long)ppVar8 + 0x30);
      for (this_03 = (unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)
                     ppVar8[1].__align; this_03 != puVar18; this_03 = this_03 + 1) {
        pIVar9 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                           (this_03);
        iVar6 = (*pIVar9->_vptr_Index[5])(pIVar9);
        if ((byte)((char)iVar6 - 1U) < 2) {
          bVar5 = ConflictInfo::ConflictTargetMatches(&conflict_info,pIVar9);
          if (bVar5) {
            sort_keys._M_h._M_buckets = (__buckets_ptr)pIVar9;
            ::std::__detail::
            _Insert<duckdb::BoundIndex_*,_duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>,_std::__detail::_Identity,_std::equal_to<duckdb::BoundIndex_*>,_std::hash<duckdb::BoundIndex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            ::insert((_Insert<duckdb::BoundIndex_*,_duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>,_std::__detail::_Identity,_std::equal_to<duckdb::BoundIndex_*>,_std::hash<duckdb::BoundIndex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                      *)&matched_indexes,(value_type *)&sort_keys);
          }
        }
      }
      pthread_mutex_unlock(local_1c8);
      column_ids = conflict_info.column_ids;
    }
    inner_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &inner_conflicts._M_t._M_impl.super__Rb_tree_header._M_header;
    inner_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    inner_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    inner_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         inner_conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    inner_conflicts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    sort_keys._M_h._M_buckets = &sort_keys._M_h._M_single_bucket;
    sort_keys._M_h._M_bucket_count = 1;
    sort_keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    sort_keys._M_h._M_element_count = 0;
    sort_keys._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    sort_keys._M_h._M_rehash_policy._M_next_resize = 0;
    sort_keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
    valid.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
    valid.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    valid.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    valid.super_TemplatedValidityMask<unsigned_long>.capacity = insert_chunk->count;
    if ((column_ids->_M_h)._M_element_count == 0) {
      p_Var16 = &matched_indexes._M_h._M_before_begin;
      while( true ) {
        p_Var16 = p_Var16->_M_nxt;
        if (p_Var16 == (__node_base *)0x0) break;
        _Var2._M_nxt = p_Var16[1]._M_nxt;
        PrepareSortKeys(insert_chunk,&sort_keys,
                        (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)(_Var2._M_nxt + 4));
        columns.
        super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        columns.
        super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        columns.
        super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        p_Var17 = _Var2._M_nxt + 6;
        while (p_Var17 = p_Var17->_M_nxt, p_Var17 != (_Hash_node_base *)0x0) {
          pmVar10 = ::std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&sort_keys,(key_type *)(p_Var17 + 1));
          not_a_conflict.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (pmVar10);
          ::std::
          vector<std::reference_wrapper<duckdb::Vector>,std::allocator<std::reference_wrapper<duckdb::Vector>>>
          ::emplace_back<std::reference_wrapper<duckdb::Vector>>
                    ((vector<std::reference_wrapper<duckdb::Vector>,std::allocator<std::reference_wrapper<duckdb::Vector>>>
                      *)&columns,(reference_wrapper<duckdb::Vector> *)&not_a_conflict);
        }
        CheckDistinctnessInternal(&valid,&columns,insert_chunk->count,&inner_conflicts);
        ::std::
        _Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
        ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                         *)&columns);
      }
    }
    else {
      PrepareSortKeys(insert_chunk,&sort_keys,column_ids);
      columns.
      super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      columns.
      super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      columns.
      super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var19 = &(column_ids->_M_h)._M_before_begin;
      while( true ) {
        p_Var19 = p_Var19->_M_nxt;
        if (p_Var19 == (__node_base *)0x0) break;
        pmVar10 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&sort_keys,(key_type *)(p_Var19 + 1));
        not_a_conflict.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)
             unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (pmVar10);
        ::std::
        vector<std::reference_wrapper<duckdb::Vector>,std::allocator<std::reference_wrapper<duckdb::Vector>>>
        ::emplace_back<std::reference_wrapper<duckdb::Vector>>
                  ((vector<std::reference_wrapper<duckdb::Vector>,std::allocator<std::reference_wrapper<duckdb::Vector>>>
                    *)&columns,(reference_wrapper<duckdb::Vector> *)&not_a_conflict);
      }
      CheckDistinctnessInternal(&valid,&columns,insert_chunk->count,&inner_conflicts);
      ::std::
      _Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
      ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                       *)&columns);
    }
    context_00 = local_1d0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&valid.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&sort_keys._M_h);
    table_01 = local_1b0;
    if (inner_conflicts._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      size = (unsigned_long *)insert_chunk->count;
      ManagedSelection::ManagedSelection((ManagedSelection *)&sort_keys,(idx_t)size,true);
      not_a_conflict.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0
      ;
      not_a_conflict.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      not_a_conflict.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var12 = (_Rb_tree_node_base *)
                &columns.
                 super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      columns.
      super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)columns.
                            super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                            .
                            super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
      columns.
      super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      not_a_conflict.super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)size;
      for (valid.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
          valid.super_TemplatedValidityMask<unsigned_long>.validity_mask < size;
          valid.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               ((long)valid.super_TemplatedValidityMask<unsigned_long>.validity_mask + 1)) {
        iVar11 = ::std::
                 _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
                 ::find(&inner_conflicts._M_t,(key_type *)&valid);
        if ((_Rb_tree_header *)iVar11._M_node != &inner_conflicts._M_t._M_impl.super__Rb_tree_header
           ) {
          p_Var4 = iVar11._M_node[1]._M_parent;
          while (__v = p_Var4, __v != iVar11._M_node[1]._M_left) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&not_a_conflict.super_TemplatedValidityMask<unsigned_long>,*(idx_t *)__v);
            p_Var4 = (_Base_ptr)&__v->_M_parent;
            if (p_Var4 == iVar11._M_node[1]._M_left) {
              ::std::
              _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              ::_M_insert_unique<unsigned_long_const&>
                        ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                          *)&columns,(unsigned_long *)__v);
            }
          }
        }
        if ((not_a_conflict.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((not_a_conflict.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [(ulong)valid.super_TemplatedValidityMask<unsigned_long>.validity_mask >> 6] >>
             ((ulong)valid.super_TemplatedValidityMask<unsigned_long>.validity_mask & 0x3f) & 1) !=
            0)) {
          if (sort_keys._M_h._M_single_bucket != (__node_base_ptr)0x0) {
            *(int *)((long)&(sort_keys._M_h._M_single_bucket)->_M_nxt->_M_nxt +
                    sort_keys._M_h._M_bucket_count * 4) =
                 (int)valid.super_TemplatedValidityMask<unsigned_long>.validity_mask;
          }
          sort_keys._M_h._M_bucket_count = sort_keys._M_h._M_bucket_count + 1;
        }
        table_01 = local_1b0;
        context_00 = local_1d0;
      }
      if (local_1d8->action_type == UPDATE) {
        if ((local_1d8->do_update_condition).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
          this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&valid,
                     "Inner conflicts detected with a conditional DO UPDATE on-conflict action, not fully implemented yet"
                     ,&local_1d9);
          NotImplementedException::NotImplementedException(this_02,(string *)&valid);
          __cxa_throw(this_02,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        ManagedSelection::ManagedSelection((ManagedSelection *)&valid,0,true);
        peVar15 = valid.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        while( true ) {
          pIVar3 = local_1b8;
          peVar15 = (element_type *)
                    ((long)&(peVar15->owned_data).
                            super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                            .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl + 1);
          if (p_Var12 ==
              (_Rb_tree_node_base *)
              &columns.
               super_vector<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::Vector>,_std::allocator<std::reference_wrapper<duckdb::Vector>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) break;
          if (local_138 != (SelectionVector *)0x0) {
            local_138->sel_vector
            [(long)((long)&peVar15[-1].owned_data.
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl + 7)] =
                 p_Var12[1]._M_color;
          }
          valid.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar15;
          p_Var12 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var12);
        }
        this_00 = &local_1b8->update_chunk;
        DataChunk::Reference(this_00,insert_chunk);
        DataChunk::Slice(this_00,(SelectionVector *)
                                 &valid.super_TemplatedValidityMask<unsigned_long>.capacity,
                         (idx_t)valid.super_TemplatedValidityMask<unsigned_long>.validity_data.
                                internal.
                                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
        (pIVar3->update_chunk).count =
             (idx_t)valid.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        ManagedSelection::~ManagedSelection((ManagedSelection *)&valid);
        context_00 = local_1d0;
      }
      DataChunk::Slice(insert_chunk,(SelectionVector *)&sort_keys._M_h._M_element_count,
                       sort_keys._M_h._M_bucket_count);
      insert_chunk->count = sort_keys._M_h._M_bucket_count;
      ::std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&columns);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&not_a_conflict.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      ManagedSelection::~ManagedSelection((ManagedSelection *)&sort_keys);
    }
    pIVar3 = local_1b8;
    op = local_1d8;
    iVar13 = HandleInsertConflicts<true>
                       (table_01,context_00,local_1b8,gstate,insert_chunk,local_1d8);
    iVar14 = HandleInsertConflicts<false>(table_01,context_00,pIVar3,gstate,insert_chunk,op);
    iVar14 = iVar14 + iVar13;
    ::std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
    ::~_Rb_tree(&inner_conflicts._M_t);
    ::std::
    _Hashtable<duckdb::BoundIndex_*,_duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>,_std::__detail::_Identity,_std::equal_to<duckdb::BoundIndex_*>,_std::hash<duckdb::BoundIndex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&matched_indexes._M_h);
  }
  return iVar14;
}

Assistant:

idx_t PhysicalInsert::OnConflictHandling(TableCatalogEntry &table, ExecutionContext &context, InsertGlobalState &gstate,
                                         InsertLocalState &lstate, DataChunk &insert_chunk) const {
	auto &data_table = table.GetStorage();
	auto &local_storage = LocalStorage::Get(context.client, data_table.db);

	if (action_type == OnConflictAction::THROW) {
		auto &constraint_state = lstate.GetConstraintState(data_table, table);
		auto storage = local_storage.GetStorage(data_table);
		data_table.VerifyAppendConstraints(constraint_state, context.client, insert_chunk, storage, nullptr);
		return 0;
	}

	ConflictInfo conflict_info(conflict_target);

	auto &global_indexes = data_table.GetDataTableInfo()->GetIndexes();
	auto &local_indexes = local_storage.GetIndexes(context.client, data_table);

	unordered_set<BoundIndex *> matched_indexes;
	if (conflict_info.column_ids.empty()) {
		// We care about every index that applies to the table if no ON CONFLICT (...) target is given
		global_indexes.Scan([&](Index &index) {
			if (!index.IsUnique()) {
				return false;
			}
			if (conflict_info.ConflictTargetMatches(index)) {
				D_ASSERT(index.IsBound());
				auto &bound_index = index.Cast<BoundIndex>();
				matched_indexes.insert(&bound_index);
			}
			return false;
		});
		local_indexes.Scan([&](Index &index) {
			if (!index.IsUnique()) {
				return false;
			}
			if (conflict_info.ConflictTargetMatches(index)) {
				D_ASSERT(index.IsBound());
				auto &bound_index = index.Cast<BoundIndex>();
				matched_indexes.insert(&bound_index);
			}
			return false;
		});
	}

	auto inner_conflicts = CheckDistinctness(insert_chunk, conflict_info, matched_indexes);
	idx_t count = insert_chunk.size();
	if (!inner_conflicts.empty()) {
		// We have at least one inner conflict, filter it out
		ManagedSelection sel_vec(count);
		ValidityMask not_a_conflict(count);
		set<idx_t> last_occurrences_of_conflict;
		for (idx_t i = 0; i < count; i++) {
			auto it = inner_conflicts.find(i);
			if (it != inner_conflicts.end()) {
				auto &conflicts = it->second;
				auto conflict_it = conflicts.begin();
				for (; conflict_it != conflicts.end();) {
					auto &idx = *conflict_it;
					not_a_conflict.SetInvalid(idx);
					conflict_it++;
					if (conflict_it == conflicts.end()) {
						last_occurrences_of_conflict.insert(idx);
					}
				}
			}
			if (not_a_conflict.RowIsValid(i)) {
				sel_vec.Append(i);
			}
		}
		if (action_type == OnConflictAction::UPDATE) {
			if (do_update_condition) {
				//! See https://github.com/duckdblabs/duckdb-internal/issues/4090 for context
				throw NotImplementedException("Inner conflicts detected with a conditional DO UPDATE on-conflict "
				                              "action, not fully implemented yet");
			}
			ManagedSelection last_occurrences(last_occurrences_of_conflict.size());
			for (auto &idx : last_occurrences_of_conflict) {
				last_occurrences.Append(idx);
			}

			lstate.update_chunk.Reference(insert_chunk);
			lstate.update_chunk.Slice(last_occurrences.Selection(), last_occurrences.Count());
			lstate.update_chunk.SetCardinality(last_occurrences.Count());
		}

		insert_chunk.Slice(sel_vec.Selection(), sel_vec.Count());
		insert_chunk.SetCardinality(sel_vec.Count());
	}

	// Check whether any conflicts arise, and if they all meet the conflict_target + condition
	// If that's not the case - We throw the first error
	idx_t updated_tuples = 0;
	updated_tuples += HandleInsertConflicts<true>(table, context, lstate, gstate, insert_chunk, *this);
	// Also check the transaction-local storage+ART so we can detect conflicts within this transaction
	updated_tuples += HandleInsertConflicts<false>(table, context, lstate, gstate, insert_chunk, *this);

	return updated_tuples;
}